

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O1

void truncate<dense_parameters>(vw *all,dense_parameters *weights)

{
  weight *pwVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  
  if (truncate<dense_parameters>(vw&,dense_parameters&)::sd == '\0') {
    iVar4 = __cxa_guard_acquire(&truncate<dense_parameters>(vw&,dense_parameters&)::sd);
    if (iVar4 != 0) {
      truncate<dense_parameters>::sd = calculate_sd<dense_parameters>(all,weights);
      __cxa_guard_release(&truncate<dense_parameters>(vw&,dense_parameters&)::sd);
    }
  }
  pwVar1 = weights->_begin;
  uVar2 = weights->_weight_mask;
  if (pwVar1 != pwVar1 + uVar2 + 1) {
    uVar3 = weights->_stride_shift;
    lVar5 = 0;
    do {
      if (truncate<dense_parameters>::sd + truncate<dense_parameters>::sd <
          (double)ABS(*(float *)((long)pwVar1 + lVar5))) {
        dVar6 = remainder((double)*(float *)((long)pwVar1 + lVar5),
                          truncate<dense_parameters>::sd + truncate<dense_parameters>::sd);
        *(float *)((long)pwVar1 + lVar5) = (float)dVar6;
      }
      lVar5 = lVar5 + (1L << ((byte)uVar3 & 0x3f)) * 4;
    } while (uVar2 * 4 + 4 != lVar5);
  }
  return;
}

Assistant:

void truncate(vw& all, T& weights)
{
  static double sd = calculate_sd(all, weights);
  for_each(weights.begin(), weights.end(), [](float& v) {
    if (abs(v) > sd * 2)
    {
      v = (float)std::remainder(v, sd * 2);
    }
  });
}